

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_dbs.cc
# Opt level: O2

int __thiscall
aliyun::Drds::DescribeDrdsDBs
          (Drds *this,DrdsDescribeDrdsDBsRequestType *req,DrdsDescribeDrdsDBsResponseType *response,
          DrdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  Value *pVVar5;
  Value *pVVar6;
  char *pcVar7;
  uint index;
  allocator<char> local_3ac;
  allocator<char> local_3ab;
  allocator<char> local_3aa;
  allocator<char> local_3a9;
  Value val;
  undefined1 local_388 [40];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  string str_response;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeDrdsDBs",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->drds_instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"DrdsInstanceId",(allocator<char> *)local_388);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"RegionId",(allocator<char> *)local_388);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,anon_var_dwarf_fb9f7 + 9,&local_3a9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_388);
        std::__cxx11::string::~string((string *)local_388);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,anon_var_dwarf_fb9f7 + 9,&local_3aa);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_388);
        std::__cxx11::string::~string((string *)local_388);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,anon_var_dwarf_fb9f7 + 9,&local_3ab);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_388);
        std::__cxx11::string::~string((string *)local_388);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_388,anon_var_dwarf_fb9f7 + 9,&local_3ac);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_388);
        std::__cxx11::string::~string((string *)local_388);
      }
      if (response != (DrdsDescribeDrdsDBsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Success");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Success");
          bVar1 = Json::Value::asBool(pVVar4);
          response->success = bVar1;
        }
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar4,"Db");
          if (bVar1) {
            pVVar4 = Json::Value::operator[](&val,"Data");
            pVVar4 = Json::Value::operator[](pVVar4,"Db");
            bVar1 = Json::Value::isArray(pVVar4);
            if (bVar1) {
              for (index = 0; AVar3 = Json::Value::size(pVVar4), index < AVar3; index = index + 1) {
                local_388._0_8_ = local_388 + 0x10;
                local_388._8_8_ = 0;
                local_388[0x10] = '\0';
                local_360._M_p = (pointer)&local_350;
                local_358 = 0;
                local_350._M_local_buf[0] = '\0';
                local_340._M_p = (pointer)&local_330;
                local_338 = 0;
                local_330._M_local_buf[0] = '\0';
                local_320._M_p = (pointer)&local_310;
                local_318 = 0;
                local_310._M_local_buf[0] = '\0';
                pVVar5 = Json::Value::operator[](pVVar4,index);
                bVar1 = Json::Value::isMember(pVVar5,"DbName");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"DbName");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)local_388,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Status");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Status");
                  local_388._32_4_ = Json::Value::asInt(pVVar6);
                }
                bVar1 = Json::Value::isMember(pVVar5,"CreateTime");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"CreateTime");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_360,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Msg");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar5,"Msg");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_340,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar5,"Mode");
                if (bVar1) {
                  pVVar5 = Json::Value::operator[](pVVar5,"Mode");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar5);
                  std::__cxx11::string::operator=((string *)&local_320,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                std::
                vector<aliyun::DrdsDescribeDrdsDBsDbType,_std::allocator<aliyun::DrdsDescribeDrdsDBsDbType>_>
                ::push_back(&response->data,(value_type *)local_388);
                DrdsDescribeDrdsDBsDbType::~DrdsDescribeDrdsDBsDbType
                          ((DrdsDescribeDrdsDBsDbType *)local_388);
              }
            }
          }
        }
      }
      goto LAB_00131e76;
    }
  }
  iVar2 = -1;
  if (error_info != (DrdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00131e76:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Drds::DescribeDrdsDBs(const DrdsDescribeDrdsDBsRequestType& req,
                      DrdsDescribeDrdsDBsResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDrdsDBs");
  if(!req.drds_instance_id.empty()) {
    req_rpc->AddRequestQuery("DrdsInstanceId", req.drds_instance_id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}